

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.h
# Opt level: O1

Literal * __thiscall wasm::Literal::convertF32ToF16(Literal *__return_storage_ptr__,Literal *this)

{
  float fVar1;
  uint uVar2;
  anon_union_4_2_5fd15f10 fp32;
  float fVar3;
  
  if ((this->type).id == 4) {
    fVar1 = (float)(this->field_0).i32;
    fVar3 = 2.0;
    if (0x70ffffff < (uint)((int)fVar1 * 2)) {
      fVar3 = (float)(((uint)fVar1 & 0x7f800000) + 0x7800000);
    }
    fVar3 = fVar3 + ABS(fVar1) * 5.192297e+33 * 7.70372e-34;
    uVar2 = 0x7e00;
    if ((uint)((int)fVar1 * 2) < 0xff000001) {
      uVar2 = ((uint)fVar3 & 0xfff) + ((uint)fVar3 >> 0xd & 0x7c00);
    }
    (__return_storage_ptr__->field_0).i32 = uVar2 | (uint)fVar1 >> 0x10 & 0x8000;
    (__return_storage_ptr__->type).id = 2;
    return __return_storage_ptr__;
  }
  __assert_fail("type == Type::f32",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                ,0x12d,"float wasm::Literal::getf32() const");
}

Assistant:

bool operator==(const BasicType& other) const { return id == other; }